

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes(Impl *this)

{
  ExecutionModel EVar1;
  bool bVar2;
  ExecutionModel in_ESI;
  
  EVar1 = this->execution_model;
  if (0x14c0 < (int)EVar1) {
    if (5 < EVar1 - ExecutionModelRayGenerationKHR) {
      if (EVar1 == ExecutionModelTaskEXT) {
        bVar2 = emit_execution_modes_amplification(this);
      }
      else {
        if (EVar1 != ExecutionModelMeshEXT) goto switchD_00124e94_default;
        bVar2 = emit_execution_modes_mesh(this);
      }
      goto LAB_00124efb;
    }
    emit_execution_modes_ray_tracing(this,in_ESI);
    goto switchD_00124e94_default;
  }
  switch(EVar1) {
  case ExecutionModelTessellationControl:
    bVar2 = emit_execution_modes_hull(this);
    break;
  case ExecutionModelTessellationEvaluation:
    bVar2 = emit_execution_modes_domain(this);
    break;
  case ExecutionModelGeometry:
    bVar2 = emit_execution_modes_geometry(this);
    break;
  case ExecutionModelFragment:
    emit_execution_modes_pixel(this);
    goto switchD_00124e94_default;
  case ExecutionModelGLCompute:
    if (this->execution_model_lib_target == true) {
      bVar2 = emit_execution_modes_node(this);
    }
    else {
      bVar2 = emit_execution_modes_compute(this);
    }
    break;
  default:
    goto switchD_00124e94_default;
  }
LAB_00124efb:
  if (bVar2 == false) {
    bVar2 = false;
  }
  else {
switchD_00124e94_default:
    emit_execution_modes_fp_denorm(this);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool Converter::Impl::emit_execution_modes()
{
	switch (execution_model)
	{
	case spv::ExecutionModelGLCompute:
		if (execution_model_lib_target)
		{
			if (!emit_execution_modes_node())
				return false;
		}
		else
		{
			if (!emit_execution_modes_compute())
				return false;
		}
		break;

	case spv::ExecutionModelGeometry:
		if (!emit_execution_modes_geometry())
			return false;
		break;

	case spv::ExecutionModelTessellationControl:
		if (!emit_execution_modes_hull())
			return false;
		break;

	case spv::ExecutionModelTessellationEvaluation:
		if (!emit_execution_modes_domain())
			return false;
		break;

	case spv::ExecutionModelFragment:
		if (!emit_execution_modes_pixel())
			return false;
		break;

	case spv::ExecutionModelRayGenerationKHR:
	case spv::ExecutionModelMissKHR:
	case spv::ExecutionModelIntersectionKHR:
	case spv::ExecutionModelAnyHitKHR:
	case spv::ExecutionModelCallableKHR:
	case spv::ExecutionModelClosestHitKHR:
		if (!emit_execution_modes_ray_tracing(execution_model))
			return false;
		break;

	case spv::ExecutionModelTaskEXT:
		if (!emit_execution_modes_amplification())
			return false;
		break;

	case spv::ExecutionModelMeshEXT:
		if (!emit_execution_modes_mesh())
			return false;
		break;

	default:
		break;
	}

	if (!emit_execution_modes_fp_denorm())
		return false;

	return true;
}